

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

void __thiscall toml::internal::Parser::Parser(Parser *this,istream *is)

{
  bool bVar1;
  istream *in_RSI;
  Lexer *in_RDI;
  Token *pTVar2;
  Token *this_00;
  Lexer *this_01;
  TokenType in_stack_ffffffffffffff7c;
  TokenType type;
  Token *in_stack_ffffffffffffff80;
  Parser *in_stack_ffffffffffffffa0;
  
  Lexer::Lexer(in_RDI,in_RSI);
  this_00 = (Token *)(in_RDI + 1);
  Token::Token(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  this_01 = in_RDI + 5;
  std::__cxx11::string::string((string *)this_01);
  bVar1 = Lexer::skipUTF8BOM(this_01);
  type = CONCAT13(SUB41(in_stack_ffffffffffffff7c >> 0x18,0),
                  CONCAT12(bVar1,(short)in_stack_ffffffffffffff7c));
  if (bVar1) {
    nextKey(in_stack_ffffffffffffffa0);
  }
  else {
    pTVar2 = (Token *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,"Invalid UTF8 BOM",(allocator *)pTVar2);
    Token::Token(in_stack_ffffffffffffff80,type,(string *)in_RDI);
    Token::operator=(this_00,pTVar2);
    Token::~Token((Token *)0x17decc);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  }
  return;
}

Assistant:

explicit Parser(std::istream& is) : lexer_(is), token_(TokenType::ERROR_TOKEN)
    {
        if (!lexer_.skipUTF8BOM()) {
            token_ = Token(TokenType::ERROR_TOKEN, std::string("Invalid UTF8 BOM"));
        } else {
            nextKey();
        }
    }